

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O0

void UnityPrintFloat(UNITY_DOUBLE input_number)

{
  int iVar1;
  int iVar2;
  int local_3c;
  char local_38 [8];
  char buf [16];
  int local_20;
  int local_1c;
  UNITY_INT32 n;
  int digits;
  int decimals;
  int exponent;
  UNITY_DOUBLE number;
  UNITY_DOUBLE input_number_local;
  
  if ((input_number < 0.0) ||
     (((decimals = (int)input_number, input_number == 0.0 && (!NAN(input_number))) &&
      (1.0 / input_number < 0.0)))) {
    putchar(0x2d);
    decimals = (int)-input_number;
  }
  if (((float)decimals != 0.0) || (NAN((float)decimals))) {
    if (NAN((float)decimals)) {
      UnityPrint("nan");
    }
    else {
      iVar2 = 1;
      if (decimals < 0) {
        iVar2 = -1;
      }
      iVar1 = 0;
      if (ABS((float)decimals) == INFINITY) {
        iVar1 = iVar2;
      }
      if (iVar1 == 0) {
        digits = 0;
        memset(local_38,0,0x10);
        for (; (float)decimals < 0.1; decimals = (int)((float)decimals * 1e+06)) {
          digits = digits + -6;
        }
        for (; (float)decimals < 100000.0; decimals = (int)((float)decimals * 10.0)) {
          digits = digits + -1;
        }
        for (; 1e+12 < (float)decimals; decimals = (int)((float)decimals / 1e+06)) {
          digits = digits + 6;
        }
        for (; 1e+06 < (float)decimals; decimals = (int)((float)decimals / 10.0)) {
          digits = digits + 1;
        }
        local_20 = ((int)((float)decimals + (float)decimals) + 1) / 2;
        if (999999 < local_20) {
          local_20 = 100000;
          digits = digits + 1;
        }
        if ((digits < 1) && (-10 < digits)) {
          local_3c = -digits;
        }
        else {
          local_3c = 5;
        }
        digits = local_3c + digits;
        for (n = local_3c; 0 < n && local_20 % 10 == 0; n = n + -1) {
          local_20 = local_20 / 10;
        }
        local_1c = 0;
        for (; local_20 != 0 || local_1c < n + 1; local_20 = local_20 / 10) {
          local_38[local_1c] = (char)(local_20 % 10) + '0';
          local_1c = local_1c + 1;
        }
        while (0 < local_1c) {
          if (local_1c == n) {
            putchar(0x2e);
          }
          local_1c = local_1c + -1;
          putchar((int)local_38[local_1c]);
        }
        if (digits != 0) {
          putchar(0x65);
          if (digits < 0) {
            putchar(0x2d);
            digits = -digits;
          }
          else {
            putchar(0x2b);
          }
          local_1c = 0;
          for (; digits != 0 || local_1c < 2; digits = digits / 10) {
            local_38[local_1c] = (char)(digits % 10) + '0';
            local_1c = local_1c + 1;
          }
          while (0 < local_1c) {
            local_1c = local_1c + -1;
            putchar((int)local_38[local_1c]);
          }
        }
      }
      else {
        UnityPrint("inf");
      }
    }
  }
  else {
    UnityPrint("0");
  }
  return;
}

Assistant:

void UnityPrintFloat(const UNITY_DOUBLE input_number)
{
    UNITY_DOUBLE number = input_number;

    /* print minus sign (including for negative zero) */
    if (number < 0.0f || (number == 0.0f && 1.0f / number < 0.0f))
    {
        UNITY_OUTPUT_CHAR('-');
        number = -number;
    }

    /* handle zero, NaN, and +/- infinity */
    if (number == 0.0f)
    {
        UnityPrint("0");
    }
    else if (isnan(number))
    {
        UnityPrint("nan");
    }
    else if (isinf(number))
    {
        UnityPrint("inf");
    }
    else
    {
        int exponent = 0;
        int decimals, digits;
        UNITY_INT32 n;
        char buf[16] = {0};

        /* scale up or down by powers of 10 */
        while (number < 100000.0f / 1e6f)  { number *= 1e6f; exponent -= 6; }
        while (number < 100000.0f)         { number *= 10.0f; exponent--; }
        while (number > 1000000.0f * 1e6f) { number /= 1e6f; exponent += 6; }
        while (number > 1000000.0f)        { number /= 10.0f; exponent++; }

        /* round to nearest integer */
        n = ((UNITY_INT32)(number + number) + 1) / 2;
        if (n > 999999)
        {
            n = 100000;
            exponent++;
        }

        /* determine where to place decimal point */
        decimals = (exponent <= 0 && exponent >= -9) ? -exponent : 5;
        exponent += decimals;

        /* truncate trailing zeroes after decimal point */
        while (decimals > 0 && n % 10 == 0)
        {
            n /= 10;
            decimals--;
        }

        /* build up buffer in reverse order */
        digits = 0;
        while (n != 0 || digits < decimals + 1)
        {
            buf[digits++] = (char)('0' + n % 10);
            n /= 10;
        }
        while (digits > 0)
        {
            if(digits == decimals) UNITY_OUTPUT_CHAR('.');
            UNITY_OUTPUT_CHAR(buf[--digits]);
        }

        /* print exponent if needed */
        if (exponent != 0)
        {
            UNITY_OUTPUT_CHAR('e');

            if(exponent < 0)
            {
                UNITY_OUTPUT_CHAR('-');
                exponent = -exponent;
            }
            else
            {
                UNITY_OUTPUT_CHAR('+');
            }

            digits = 0;
            while (exponent != 0 || digits < 2)
            {
                buf[digits++] = (char)('0' + exponent % 10);
                exponent /= 10;
            }
            while (digits > 0)
            {
                UNITY_OUTPUT_CHAR(buf[--digits]);
            }
        }
    }
}